

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::UseExpr::toString_abi_cxx11_(string *__return_storage_ptr__,UseExpr *this)

{
  pointer puVar1;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"use ","");
  puVar1 = (this->exprs).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (this->exprs).
                super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (puVar1 != (this->exprs).
                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      (*((puVar1->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      puVar1 = puVar1 + 1;
    } while (puVar1 != (this->exprs).
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UseExpr::toString() const noexcept {
  std::string result = "use ";
  for (auto it = exprs.begin(); it != exprs.end(); ++it) {
    if (it != exprs.begin())
      result += ", ";
      
    result += (*it)->toString();
  }

  return result;
}